

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenEM64T.cpp
# Opt level: O0

void __thiscall
Centaurus::ParserEM64T<unsigned_char>::emit_machine
          (ParserEM64T<unsigned_char> *this,X86Assembler *as,ATNMachine<unsigned_char> *machine,
          unordered_map<Centaurus::Identifier,_asmjit::Label,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>_>
          *machine_map,CompositeATN<unsigned_char> *catn,Identifier *id,Label *rejectlabel,
          MyConstPool *pool)

{
  int iVar1;
  int iVar2;
  ATNNodeType AVar3;
  reference pvVar4;
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_> *str;
  Identifier *__k;
  NFA<unsigned_char> *nfa;
  vector<Centaurus::ATNTransition<unsigned_char>,_std::allocator<Centaurus::ATNTransition<unsigned_char>_>_>
  *this_00;
  size_type sVar5;
  ATNTransition<unsigned_char> *this_01;
  Operand_ *in_stack_fffffffffffff6e8;
  uint32_t instId;
  X86Assembler *o1;
  uint32_t uVar6;
  CodeEmitter *in_stack_fffffffffffff6f0;
  Label *in_stack_fffffffffffff6f8;
  CodeEmitter *in_stack_fffffffffffff700;
  CompositeATN<unsigned_char> *in_stack_fffffffffffff708;
  undefined4 in_stack_fffffffffffff710;
  int in_stack_fffffffffffff714;
  ATNTransition<unsigned_char> *in_stack_fffffffffffff718;
  uint32_t instId_00;
  undefined4 in_stack_fffffffffffff720;
  int in_stack_fffffffffffff724;
  ATNPath local_7f8;
  ATNPath local_7d8;
  LookaheadDFA<unsigned_char> local_7b8;
  int local_794;
  undefined1 local_790 [4];
  int j;
  vector<asmjit::Label,_std::allocator<asmjit::Label>_> exitlabels;
  undefined1 local_760 [4];
  int outbound_num;
  ATNNode<unsigned_char> *local_740;
  ATNNode<unsigned_char> *node;
  undefined8 uStack_730;
  int i_1;
  undefined4 local_728;
  undefined4 local_724;
  undefined1 local_720 [8];
  Label requestpage2_label;
  Label requestpage1_label;
  int local_6dc;
  undefined1 local_6d8 [4];
  int i;
  vector<asmjit::Label,_std::allocator<asmjit::Label>_> statelabels;
  Identifier *id_local;
  CompositeATN<unsigned_char> *catn_local;
  unordered_map<Centaurus::Identifier,_asmjit::Label,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>_>
  *machine_map_local;
  ATNMachine<unsigned_char> *machine_local;
  X86Assembler *as_local;
  ParserEM64T<unsigned_char> *this_local;
  uint32_t signature;
  uint32_t signature_1;
  uint32_t signature_2;
  uint32_t signature_3;
  
  statelabels.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)id;
  std::vector<asmjit::Label,_std::allocator<asmjit::Label>_>::vector
            ((vector<asmjit::Label,_std::allocator<asmjit::Label>_> *)local_6d8);
  for (local_6dc = 0; iVar1 = ATNMachine<unsigned_char>::get_node_num(machine), local_6dc < iVar1;
      local_6dc = local_6dc + 1) {
    (*(as->super_Assembler).super_CodeEmitter._vptr_CodeEmitter[7])
              ((undefined1 *)((long)&requestpage1_label.super_Operand.super_Operand_.field_0 + 8));
    std::vector<asmjit::Label,_std::allocator<asmjit::Label>_>::push_back
              ((vector<asmjit::Label,_std::allocator<asmjit::Label>_> *)local_6d8,
               (value_type *)((long)&requestpage1_label.super_Operand.super_Operand_.field_0 + 8));
  }
  (*(as->super_Assembler).super_CodeEmitter._vptr_CodeEmitter[7])
            ((undefined1 *)((long)&requestpage2_label.super_Operand.super_Operand_.field_0 + 8));
  (*(as->super_Assembler).super_CodeEmitter._vptr_CodeEmitter[7])(local_720);
  asmjit::CodeEmitter::emit
            (in_stack_fffffffffffff700,(uint32_t)((ulong)in_stack_fffffffffffff6f8 >> 0x20),
             (Operand_ *)in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  asmjit::CodeEmitter::emit
            (in_stack_fffffffffffff700,(uint32_t)((ulong)in_stack_fffffffffffff6f8 >> 0x20),
             (Operand_ *)in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  ATNMachine<unsigned_char>::get_unique_id(machine);
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
             (uint32_t)((ulong)in_stack_fffffffffffff718 >> 0x20),
             (Operand_ *)CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
             (int)((ulong)in_stack_fffffffffffff708 >> 0x20));
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
             (uint32_t)((ulong)in_stack_fffffffffffff718 >> 0x20),
             (Operand_ *)CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
             (int)((ulong)in_stack_fffffffffffff708 >> 0x20));
  asmjit::CodeEmitter::emit
            (in_stack_fffffffffffff700,(uint32_t)((ulong)in_stack_fffffffffffff6f8 >> 0x20),
             (Operand_ *)in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  uStack_730 = 0x32;
  local_724 = 7;
  local_728 = 0;
  asmjit::CodeEmitter::emit
            (in_stack_fffffffffffff700,(uint32_t)((ulong)in_stack_fffffffffffff6f8 >> 0x20),
             (Operand_ *)in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
             (uint32_t)((ulong)in_stack_fffffffffffff718 >> 0x20),
             (Operand_ *)CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
             (int)((ulong)in_stack_fffffffffffff708 >> 0x20));
  asmjit::CodeEmitter::emit
            (in_stack_fffffffffffff700,(uint32_t)((ulong)in_stack_fffffffffffff6f8 >> 0x20),
             (Operand_ *)in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
  asmjit::CodeEmitter::emit
            (in_stack_fffffffffffff6f0,(uint32_t)((ulong)in_stack_fffffffffffff6e8 >> 0x20),
             (Operand_ *)0x17126b);
  node._4_4_ = 0;
  while( true ) {
    iVar1 = node._4_4_;
    iVar2 = ATNMachine<unsigned_char>::get_node_num(machine);
    uVar6 = (uint32_t)((ulong)in_stack_fffffffffffff6f8 >> 0x20);
    instId_00 = (uint32_t)((ulong)in_stack_fffffffffffff718 >> 0x20);
    if (iVar2 <= iVar1) break;
    pvVar4 = std::vector<asmjit::Label,_std::allocator<asmjit::Label>_>::operator[]
                       ((vector<asmjit::Label,_std::allocator<asmjit::Label>_> *)local_6d8,
                        (long)node._4_4_);
    (*(as->super_Assembler).super_CodeEmitter._vptr_CodeEmitter[9])(as,pvVar4);
    local_740 = ATNMachine<unsigned_char>::get_node(machine,node._4_4_);
    AVar3 = ATNNode<unsigned_char>::type(local_740);
    switch(AVar3) {
    case Blank:
      break;
    case Nonterminal:
      __k = ATNNode<unsigned_char>::get_invoke(local_740);
      std::
      unordered_map<Centaurus::Identifier,_asmjit::Label,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_asmjit::Label>_>_>
      ::operator[](machine_map,__k);
      asmjit::CodeEmitter::emit
                (in_stack_fffffffffffff6f0,(uint32_t)((ulong)in_stack_fffffffffffff6e8 >> 0x20),
                 (Operand_ *)0x171436);
      break;
    case LiteralTerminal:
      str = ATNNode<unsigned_char>::get_literal_abi_cxx11_(local_740);
      MatchRoutineEM64T<unsigned_char>::emit(as,pool,rejectlabel,str);
      break;
    case RegularTerminal:
      nfa = ATNNode<unsigned_char>::get_nfa(local_740);
      DFA<unsigned_char>::DFA((DFA<unsigned_char> *)local_760,nfa,true);
      DFARoutineEM64T<unsigned_char>::emit(as,rejectlabel,(DFA<unsigned_char> *)local_760,pool);
      DFA<unsigned_char>::~DFA((DFA<unsigned_char> *)local_760);
      break;
    case WhiteSpace:
      SkipRoutineEM64T<unsigned_char>::emit(as);
    }
    this_00 = ATNNode<unsigned_char>::get_transitions(local_740);
    sVar5 = std::
            vector<Centaurus::ATNTransition<unsigned_char>,_std::allocator<Centaurus::ATNTransition<unsigned_char>_>_>
            ::size(this_00);
    iVar1 = (int)sVar5;
    if (iVar1 == 0) {
      asmjit::CodeEmitter::emit
                (in_stack_fffffffffffff700,(uint32_t)((ulong)in_stack_fffffffffffff6f8 >> 0x20),
                 (Operand_ *)in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
      asmjit::CodeEmitter::emit
                (in_stack_fffffffffffff700,(uint32_t)((ulong)in_stack_fffffffffffff6f8 >> 0x20),
                 (Operand_ *)in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
      ATNMachine<unsigned_char>::get_unique_id(machine);
      asmjit::CodeEmitter::emit
                ((CodeEmitter *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                 (uint32_t)((ulong)in_stack_fffffffffffff718 >> 0x20),
                 (Operand_ *)CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
                 (int)((ulong)in_stack_fffffffffffff708 >> 0x20));
      asmjit::CodeEmitter::emit
                ((CodeEmitter *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                 (uint32_t)((ulong)in_stack_fffffffffffff718 >> 0x20),
                 (Operand_ *)CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
                 (int)((ulong)in_stack_fffffffffffff708 >> 0x20));
      asmjit::CodeEmitter::emit
                (in_stack_fffffffffffff700,(uint32_t)((ulong)in_stack_fffffffffffff6f8 >> 0x20),
                 (Operand_ *)in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
      exitlabels.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x32;
      asmjit::CodeEmitter::emit
                (in_stack_fffffffffffff700,(uint32_t)((ulong)in_stack_fffffffffffff6f8 >> 0x20),
                 (Operand_ *)in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
      asmjit::CodeEmitter::emit
                ((CodeEmitter *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),
                 (uint32_t)((ulong)in_stack_fffffffffffff718 >> 0x20),
                 (Operand_ *)CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
                 (int)((ulong)in_stack_fffffffffffff708 >> 0x20));
      asmjit::CodeEmitter::emit
                (in_stack_fffffffffffff700,(uint32_t)((ulong)in_stack_fffffffffffff6f8 >> 0x20),
                 (Operand_ *)in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
      asmjit::CodeEmitter::emit
                (in_stack_fffffffffffff6f0,(uint32_t)((ulong)in_stack_fffffffffffff6e8 >> 0x20),
                 (Operand_ *)0x17198b);
      asmjit::CodeEmitter::emit
                (in_stack_fffffffffffff6f0,(uint32_t)((ulong)in_stack_fffffffffffff6e8 >> 0x20));
    }
    else if (iVar1 == 1) {
      this_01 = ATNNode<unsigned_char>::get_transition(local_740,0);
      in_stack_fffffffffffff724 = ATNTransition<unsigned_char>::dest(this_01);
      std::vector<asmjit::Label,_std::allocator<asmjit::Label>_>::operator[]
                ((vector<asmjit::Label,_std::allocator<asmjit::Label>_> *)local_6d8,
                 (long)in_stack_fffffffffffff724);
      asmjit::CodeEmitter::emit
                (in_stack_fffffffffffff6f0,(uint32_t)((ulong)in_stack_fffffffffffff6e8 >> 0x20),
                 (Operand_ *)0x171a3f);
    }
    else {
      std::vector<asmjit::Label,_std::allocator<asmjit::Label>_>::vector
                ((vector<asmjit::Label,_std::allocator<asmjit::Label>_> *)local_790);
      for (local_794 = 0; local_794 < iVar1; local_794 = local_794 + 1) {
        in_stack_fffffffffffff718 = ATNNode<unsigned_char>::get_transition(local_740,local_794);
        in_stack_fffffffffffff714 = ATNTransition<unsigned_char>::dest(in_stack_fffffffffffff718);
        pvVar4 = std::vector<asmjit::Label,_std::allocator<asmjit::Label>_>::operator[]
                           ((vector<asmjit::Label,_std::allocator<asmjit::Label>_> *)local_6d8,
                            (long)in_stack_fffffffffffff714);
        std::vector<asmjit::Label,_std::allocator<asmjit::Label>_>::push_back
                  ((vector<asmjit::Label,_std::allocator<asmjit::Label>_> *)local_790,pvVar4);
      }
      in_stack_fffffffffffff6f0 = (CodeEmitter *)as;
      in_stack_fffffffffffff6f8 = rejectlabel;
      in_stack_fffffffffffff700 = (CodeEmitter *)catn;
      in_stack_fffffffffffff708 = catn;
      ATNPath::ATNPath(&local_7f8,
                       (Identifier *)
                       statelabels.super__Vector_base<asmjit::Label,_std::allocator<asmjit::Label>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,node._4_4_);
      CompositeATN<unsigned_char>::convert_atn_path
                (&local_7d8,(CompositeATN<unsigned_char> *)in_stack_fffffffffffff700,&local_7f8);
      LookaheadDFA<unsigned_char>::LookaheadDFA
                (&local_7b8,in_stack_fffffffffffff708,&local_7d8,true);
      LDFARoutineEM64T<unsigned_char>::emit
                ((X86Assembler *)in_stack_fffffffffffff6f0,in_stack_fffffffffffff6f8,&local_7b8,
                 (vector<asmjit::Label,_std::allocator<asmjit::Label>_> *)local_790);
      LookaheadDFA<unsigned_char>::~LookaheadDFA(&local_7b8);
      ATNPath::~ATNPath(&local_7d8);
      ATNPath::~ATNPath(&local_7f8);
      std::vector<asmjit::Label,_std::allocator<asmjit::Label>_>::~vector
                ((vector<asmjit::Label,_std::allocator<asmjit::Label>_> *)local_790);
    }
    node._4_4_ = node._4_4_ + 1;
  }
  (*(as->super_Assembler).super_CodeEmitter._vptr_CodeEmitter[9])
            (as,(undefined1 *)((long)&requestpage2_label.super_Operand.super_Operand_.field_0 + 8));
  asmjit::CodeEmitter::emit
            (in_stack_fffffffffffff6f0,(uint32_t)((ulong)in_stack_fffffffffffff6e8 >> 0x20),
             (Operand_ *)0x171ca0);
  asmjit::CodeEmitter::emit
            (in_stack_fffffffffffff6f0,(uint32_t)((ulong)in_stack_fffffffffffff6e8 >> 0x20),
             (Operand_ *)0x171cde);
  asmjit::CodeEmitter::emit
            (in_stack_fffffffffffff6f0,(uint32_t)((ulong)in_stack_fffffffffffff6e8 >> 0x20),
             (Operand_ *)0x171d1c);
  asmjit::CodeEmitter::emit
            (in_stack_fffffffffffff6f0,(uint32_t)((ulong)in_stack_fffffffffffff6e8 >> 0x20),
             (Operand_ *)0x171d5a);
  asmjit::CodeEmitter::emit
            (in_stack_fffffffffffff700,uVar6,(Operand_ *)in_stack_fffffffffffff6f0,
             in_stack_fffffffffffff6e8);
  asmjit::CodeEmitter::emit
            (in_stack_fffffffffffff700,uVar6,(Operand_ *)in_stack_fffffffffffff6f0,
             in_stack_fffffffffffff6e8);
  asmjit::CodeEmitter::emit
            (in_stack_fffffffffffff6f0,(uint32_t)((ulong)in_stack_fffffffffffff6e8 >> 0x20));
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
             (uint32_t)((ulong)in_stack_fffffffffffff708 >> 0x20),(int64_t)in_stack_fffffffffffff700
            );
  asmjit::CodeEmitter::emit
            (in_stack_fffffffffffff700,uVar6,(Operand_ *)in_stack_fffffffffffff6f0,
             in_stack_fffffffffffff6e8);
  asmjit::CodeEmitter::emit
            (in_stack_fffffffffffff700,uVar6,(Operand_ *)in_stack_fffffffffffff6f0,
             in_stack_fffffffffffff6e8);
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),instId_00,
             (Operand_ *)CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
             (int64_t)in_stack_fffffffffffff708);
  asmjit::CodeEmitter::emit
            (in_stack_fffffffffffff700,uVar6,(Operand_ *)in_stack_fffffffffffff6f0,
             in_stack_fffffffffffff6e8);
  instId = (uint32_t)((ulong)in_stack_fffffffffffff6e8 >> 0x20);
  asmjit::CodeEmitter::emit(in_stack_fffffffffffff6f0,instId,(Operand_ *)0x17216e);
  asmjit::CodeEmitter::emit(in_stack_fffffffffffff6f0,instId,(Operand_ *)0x1721ac);
  asmjit::CodeEmitter::emit(in_stack_fffffffffffff6f0,instId,(Operand_ *)0x1721ea);
  asmjit::CodeEmitter::emit(in_stack_fffffffffffff6f0,instId,(Operand_ *)0x172228);
  o1 = as;
  std::vector<asmjit::Label,_std::allocator<asmjit::Label>_>::operator[]
            ((vector<asmjit::Label,_std::allocator<asmjit::Label>_> *)local_6d8,0);
  asmjit::CodeEmitter::emit
            (in_stack_fffffffffffff6f0,(uint32_t)((ulong)o1 >> 0x20),(Operand_ *)0x172277);
  (*(as->super_Assembler).super_CodeEmitter._vptr_CodeEmitter[9])(as,local_720);
  asmjit::CodeEmitter::emit
            (in_stack_fffffffffffff6f0,(uint32_t)((ulong)o1 >> 0x20),(Operand_ *)0x1722ce);
  asmjit::CodeEmitter::emit
            (in_stack_fffffffffffff6f0,(uint32_t)((ulong)o1 >> 0x20),(Operand_ *)0x17230c);
  asmjit::CodeEmitter::emit
            (in_stack_fffffffffffff6f0,(uint32_t)((ulong)o1 >> 0x20),(Operand_ *)0x17234a);
  asmjit::CodeEmitter::emit
            (in_stack_fffffffffffff6f0,(uint32_t)((ulong)o1 >> 0x20),(Operand_ *)0x172388);
  asmjit::CodeEmitter::emit
            (in_stack_fffffffffffff700,uVar6,(Operand_ *)in_stack_fffffffffffff6f0,(Operand_ *)o1);
  asmjit::CodeEmitter::emit
            (in_stack_fffffffffffff700,uVar6,(Operand_ *)in_stack_fffffffffffff6f0,(Operand_ *)o1);
  asmjit::CodeEmitter::emit(in_stack_fffffffffffff6f0,(uint32_t)((ulong)o1 >> 0x20));
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
             (uint32_t)((ulong)in_stack_fffffffffffff708 >> 0x20),(int64_t)in_stack_fffffffffffff700
            );
  asmjit::CodeEmitter::emit
            (in_stack_fffffffffffff700,uVar6,(Operand_ *)in_stack_fffffffffffff6f0,(Operand_ *)o1);
  asmjit::CodeEmitter::emit
            (in_stack_fffffffffffff700,uVar6,(Operand_ *)in_stack_fffffffffffff6f0,(Operand_ *)o1);
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)CONCAT44(in_stack_fffffffffffff724,in_stack_fffffffffffff720),instId_00,
             (Operand_ *)CONCAT44(in_stack_fffffffffffff714,in_stack_fffffffffffff710),
             (int64_t)in_stack_fffffffffffff708);
  asmjit::CodeEmitter::emit
            (in_stack_fffffffffffff700,uVar6,(Operand_ *)in_stack_fffffffffffff6f0,(Operand_ *)o1);
  uVar6 = (uint32_t)((ulong)o1 >> 0x20);
  asmjit::CodeEmitter::emit(in_stack_fffffffffffff6f0,uVar6,(Operand_ *)0x17279c);
  asmjit::CodeEmitter::emit(in_stack_fffffffffffff6f0,uVar6,(Operand_ *)0x1727da);
  asmjit::CodeEmitter::emit(in_stack_fffffffffffff6f0,uVar6,(Operand_ *)0x172818);
  asmjit::CodeEmitter::emit(in_stack_fffffffffffff6f0,uVar6,(Operand_ *)0x172856);
  asmjit::CodeEmitter::emit(in_stack_fffffffffffff6f0,uVar6);
  std::vector<asmjit::Label,_std::allocator<asmjit::Label>_>::~vector
            ((vector<asmjit::Label,_std::allocator<asmjit::Label>_> *)local_6d8);
  return;
}

Assistant:

void ParserEM64T<TCHAR>::emit_machine(asmjit::X86Assembler& as, const ATNMachine<TCHAR>& machine, std::unordered_map<Identifier, asmjit::Label>& machine_map, const CompositeATN<TCHAR>& catn, const Identifier& id, asmjit::Label& rejectlabel, MyConstPool& pool)
{
    std::vector<asmjit::Label> statelabels;

    for (int i = 0; i < machine.get_node_num(); i++)
    {
        statelabels.push_back(as.newLabel());
    }

    asmjit::Label requestpage1_label = as.newLabel();
    asmjit::Label requestpage2_label = as.newLabel();

    {
        //Write the start marker to the AST buffer.
        //Structure of the start marker (64 bits, Little Endian):
        //64  63       48               0
        //+---+--------+----------------+
        //| 1 | ATN ID | Start Position |
        //+---+--------+----------------+
        
        as.mov(MARKER_REG, INPUT_REG);
        as.sub(MARKER_REG, INPUT_BASE_REG);
        as.mov(ID_REG, machine.get_unique_id() | (1 << 15));
        as.shl(ID_REG, 48);
        as.or_(MARKER_REG, ID_REG);
        as.movnti(asmjit::X86Mem(OUTPUT_REG, 0), MARKER_REG);
        as.add(OUTPUT_REG, 8);
        as.cmp(OUTPUT_REG, OUTPUT_BOUND_REG);
        as.je(requestpage1_label);
    }

    for (int i = 0; i < machine.get_node_num(); i++)
    {
        as.bind(statelabels[i]);

        const ATNNode<TCHAR>& node = machine.get_node(i);

        switch (node.type())
        {
        case ATNNodeType::Blank:
            break;
        case ATNNodeType::LiteralTerminal:
            MatchRoutineEM64T<TCHAR>::emit(as, pool, rejectlabel, node.get_literal());
            break;
        case ATNNodeType::Nonterminal:
            as.call(machine_map[node.get_invoke()]);
            break;
        case ATNNodeType::RegularTerminal:
            DFARoutineEM64T<TCHAR>::emit(as, rejectlabel, DFA<TCHAR>(node.get_nfa()), pool);
            break;
        case ATNNodeType::WhiteSpace:
            SkipRoutineEM64T<TCHAR>::emit(as);
            break;
        }

        int outbound_num = node.get_transitions().size();
        if (outbound_num == 0)
        {
            //Write the end marker to the AST buffer.
            //Structure of the end marker:
            //64  63       48             0
            //+---+--------+--------------+
            //| 0 | ATN ID | End Position |
            //+---+--------+--------------+

            as.mov(MARKER_REG, INPUT_REG);
            as.sub(MARKER_REG, INPUT_BASE_REG);
            as.mov(ID_REG, machine.get_unique_id());
            as.shl(ID_REG, 48);
            as.or_(MARKER_REG, ID_REG);
            as.movnti(asmjit::X86Mem(OUTPUT_REG, 0), MARKER_REG);
            as.add(OUTPUT_REG, 8);
            as.cmp(OUTPUT_REG, OUTPUT_BOUND_REG);
            as.je(requestpage2_label);
            as.ret();
        }
        else if (outbound_num == 1)
        {
            as.jmp(statelabels[node.get_transition(0).dest()]);
        }
        else
        {
            std::vector<asmjit::Label> exitlabels;

            for (int j = 0; j < outbound_num; j++)
            {
                exitlabels.push_back(statelabels[node.get_transition(j).dest()]);
            }

            LDFARoutineEM64T<TCHAR>::emit(as, rejectlabel, LookaheadDFA<TCHAR>(catn, catn.convert_atn_path(ATNPath(id, i))), exitlabels);
        }
    }

    as.bind(requestpage1_label);
    {
        as.push(INPUT_REG);
        as.push(INPUT_BASE_REG);
        as.push(CONTEXT_REG);
        as.push(STACK_BACKUP_REG);
        as.movdqa(asmjit::x86::xmm15, PATTERN_REG);
        as.mov(ARG1_REG, asmjit::X86Mem(asmjit::x86::rsp, 8));
#if defined(CENTAURUS_BUILD_WINDOWS)
        as.sub(asmjit::x86::rsp, 32);
#endif
        as.sfence();
        as.call((uint64_t)request_page);
#if defined(CENTAURUS_BUILD_WINDOWS)
        as.add(asmjit::x86::rsp, 32);
#endif
        as.mov(OUTPUT_REG, asmjit::x86::rax);
        as.mov(OUTPUT_BOUND_REG, OUTPUT_REG);
        as.add(OUTPUT_BOUND_REG, AST_BUF_SIZE);
        as.movdqa(PATTERN_REG, asmjit::x86::xmm15);
        as.pop(STACK_BACKUP_REG);
        as.pop(CONTEXT_REG);
        as.pop(INPUT_BASE_REG);
        as.pop(INPUT_REG);

        as.jmp(statelabels[0]);
    }
    as.bind(requestpage2_label);
    {
        as.push(INPUT_REG);
        as.push(INPUT_BASE_REG);
        as.push(CONTEXT_REG);
        as.push(STACK_BACKUP_REG);
        as.movdqa(asmjit::x86::xmm15, PATTERN_REG);
        as.mov(ARG1_REG, asmjit::X86Mem(asmjit::x86::rsp, 8));
#if defined(CENTAURUS_BUILD_WINDOWS)
        as.sub(asmjit::x86::rsp, 32);
#endif
        as.sfence();
        as.call((uint64_t)request_page);
#if defined(CENTAURUS_BUILD_WINDOWS)
        as.add(asmjit::x86::rsp, 32);
#endif
        as.mov(OUTPUT_REG, asmjit::x86::rax);
        as.mov(OUTPUT_BOUND_REG, OUTPUT_REG);
        as.add(OUTPUT_BOUND_REG, AST_BUF_SIZE);
        as.movdqa(PATTERN_REG, asmjit::x86::xmm15);
        as.pop(STACK_BACKUP_REG);
        as.pop(CONTEXT_REG);
        as.pop(INPUT_BASE_REG);
        as.pop(INPUT_REG);

        as.ret();
    }
}